

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O2

vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
* __thiscall
pstore::region::factory::create<pstore::file::file_handle,pstore::memory_mapper>
          (vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
           *__return_storage_ptr__,factory *this,shared_ptr<pstore::file::file_handle> *file)

{
  uint64_t bytes_to_map;
  region_builder<pstore::file::file_handle,_pstore::memory_mapper> builder;
  __shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2> _Stack_58;
  region_builder<pstore::file::file_handle,_pstore::memory_mapper> local_48;
  
  bytes_to_map = pstore::file::file_handle::size
                           ((file->
                            super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr);
  std::__shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_58,
             &file->super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>);
  region_builder<pstore::file::file_handle,_pstore::memory_mapper>::region_builder
            (&local_48,(shared_ptr<pstore::file::file_handle> *)&_Stack_58,this->full_size_,
             this->min_size_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_58._M_refcount);
  region_builder<pstore::file::file_handle,_pstore::memory_mapper>::operator()
            (__return_storage_ptr__,&local_48,bytes_to_map);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.file_.
              super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return __return_storage_ptr__;
}

Assistant:

auto factory::create (std::shared_ptr<File> file) -> std::vector<memory_mapper_ptr> {

            // There's no lock on the file when we call the size() method here. However, the file
            // is only allowed to grow so if it changes then the worst outcome is that we end up
            // memory mapping more of it beyond the logical size.

            std::uint64_t const file_size = file->size ();
            region_builder<File, MemoryMapper> builder (file, this->full_size (),
                                                        this->min_size ());
            return builder (file_size);
        }